

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGenerators.cpp
# Opt level: O1

void __thiscall
chrono::utils::MixtureIngredient::setDefaultMaterial
          (MixtureIngredient *this,shared_ptr<chrono::ChMaterialSurface> *mat)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  int iVar4;
  ChMaterialSurfaceSMC *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  iVar3 = (*((mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            )->_vptr_ChMaterialSurface[3])();
  iVar4 = (*(this->m_generator->m_system->super_ChIntegrableIIorder).super_ChIntegrable.
            _vptr_ChIntegrable[0x2f])();
  if (iVar3 == iVar4) {
    iVar3 = (*((mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->_vptr_ChMaterialSurface[3])();
    peVar1 = (element_type *)
             (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    p_Var2 = (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (iVar3 == 0) {
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      (this->m_defMaterialNSC).
      super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)peVar1;
      this_00 = (this->m_defMaterialNSC).
                super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (this->m_defMaterialNSC).
      super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = p_Var2;
    }
    else {
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      (this->m_defMaterialSMC).
      super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
      this_00 = (this->m_defMaterialSMC).
                super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (this->m_defMaterialSMC).
      super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = p_Var2;
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    freeMaterialDist(this);
    return;
  }
  __assert_fail("mat->GetContactMethod() == m_generator->m_system->GetContactMethod()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/utils/ChUtilsGenerators.cpp"
                ,0x39,
                "void chrono::utils::MixtureIngredient::setDefaultMaterial(std::shared_ptr<ChMaterialSurface>)"
               );
}

Assistant:

void MixtureIngredient::setDefaultMaterial(std::shared_ptr<ChMaterialSurface> mat) {
    assert(mat->GetContactMethod() == m_generator->m_system->GetContactMethod());

    if (mat->GetContactMethod() == ChContactMethod::NSC) {
        m_defMaterialNSC = std::static_pointer_cast<ChMaterialSurfaceNSC>(mat);
    } else {
        m_defMaterialSMC = std::static_pointer_cast<ChMaterialSurfaceSMC>(mat);
    }

    freeMaterialDist();
}